

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlphaVectorPlanning.cpp
# Opt level: O0

VectorSet * __thiscall
AlphaVectorPlanning::CrossSum(AlphaVectorPlanning *this,VectorSet *A,VectorSet *B)

{
  size_type sVar1;
  size_type sVar2;
  size_type sVar3;
  const_reference pdVar4;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *in_RCX;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *in_RDX;
  VectorSet *in_RDI;
  int s;
  int j;
  int i;
  int k;
  int nrS;
  int nrInB;
  int nrInA;
  VectorSet *C;
  double i_00;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *in_stack_ffffffffffffff80;
  double in_stack_ffffffffffffff88;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *in_stack_ffffffffffffff90;
  VectorSet *size1;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *in_stack_ffffffffffffffb0;
  int local_40;
  int local_3c;
  int local_38;
  
  size1 = in_RDI;
  sVar1 = boost::numeric::ublas::
          matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
          ::size1(in_RDX);
  sVar2 = boost::numeric::ublas::
          matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
          ::size1(in_RCX);
  sVar3 = boost::numeric::ublas::
          matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
          ::size2(in_RDX);
  boost::numeric::ublas::
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  ::matrix(in_stack_ffffffffffffffb0,(size_type)size1,(size_type)in_RDI);
  for (local_38 = 0; local_38 != (int)sVar1; local_38 = local_38 + 1) {
    for (local_3c = 0; local_3c != (int)sVar2; local_3c = local_3c + 1) {
      for (local_40 = 0; local_40 != (int)sVar3; local_40 = local_40 + 1) {
        pdVar4 = boost::numeric::ublas::
                 matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                 ::operator()(in_stack_ffffffffffffff90,(size_type)in_stack_ffffffffffffff88,
                              (size_type)in_stack_ffffffffffffff80);
        in_stack_ffffffffffffff88 = *pdVar4;
        in_stack_ffffffffffffff90 =
             (matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
              *)boost::numeric::ublas::
                matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                ::operator()(in_stack_ffffffffffffff90,(size_type)in_stack_ffffffffffffff88,
                             (size_type)in_stack_ffffffffffffff80);
        i_00 = in_stack_ffffffffffffff88 + (double)in_stack_ffffffffffffff90->size1_;
        in_stack_ffffffffffffff80 =
             (matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
              *)boost::numeric::ublas::
                matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                ::operator()(in_stack_ffffffffffffff80,(size_type)i_00,0x90a8db);
        in_stack_ffffffffffffff80->size1_ = (size_type)i_00;
      }
    }
  }
  return in_RDI;
}

Assistant:

VectorSet AlphaVectorPlanning::CrossSum(const VectorSet &A,
                                        const VectorSet &B) const
{
    int nrInA=A.size1(),
        nrInB=B.size1(),
        nrS=A.size2();

#if DEBUG_AlphaVectorPlanning_CrossSum
    cout << "AlphaVectorPlanning::CrossSum of " << nrInA 
         << " times " << nrInB << endl;
#endif

    VectorSet C(nrInA*nrInB,nrS);
    
    int k=-1;
    for(int i=0;i!=nrInA;i++)
        for(int j=0;j!=nrInB;j++)
        {
            k++;
            for(int s=0;s!=nrS;s++)
                C(k,s)=A(i,s)+B(j,s);
        }

    return(C);
}